

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::TransposeLayerParams::SerializeWithCachedSizes
          (TransposeLayerParams *this,CodedOutputStream *output)

{
  uint64 value;
  int index;
  int iVar1;
  
  iVar1 = (this->axes_).current_size_;
  if (0 < iVar1) {
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,10);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_axes_cached_byte_size_);
    iVar1 = (this->axes_).current_size_;
  }
  index = 0;
  if (iVar1 < 1) {
    iVar1 = 0;
    index = 0;
  }
  for (; iVar1 != index; index = index + 1) {
    value = axes(this,index);
    google::protobuf::io::CodedOutputStream::WriteVarint64(output,value);
  }
  return;
}

Assistant:

void TransposeLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.TransposeLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated uint64 axes = 1;
  if (this->axes_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_axes_cached_byte_size_);
  }
  for (int i = 0, n = this->axes_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->axes(i), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.TransposeLayerParams)
}